

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O3

void __thiscall
vkt::sr::ShaderRenderCaseInstance::useUniform
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,BaseUniformType type)

{
  ostringstream *this_00;
  size_t dataSize;
  undefined1 local_198 [384];
  
  switch(type) {
  case UB_FALSE:
  case UI_ZERO:
  case UF_ZERO:
    local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
    break;
  case UB_TRUE:
  case UI_ONE:
    local_198._0_4_ = 1;
    break;
  case UB4_FALSE:
  case UI4_ZERO:
  case UV4_ZERO:
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    local_198[8] = (ostringstream)0x0;
    local_198._9_3_ = 0;
    local_198._12_4_ = 0;
    goto LAB_0062a254;
  case UB4_TRUE:
  case UV4_ONE:
  case UV4_WHITE:
    local_198._0_4_ = 0x3f800000;
    local_198._4_4_ = 0x3f800000;
    local_198[8] = (ostringstream)0x0;
    local_198._9_3_ = 0x3f8000;
    local_198._12_4_ = 0x3f800000;
    goto LAB_0062a254;
  case UI_TWO:
    local_198._0_4_ = 2;
    break;
  case UI_THREE:
    local_198._0_4_ = 3;
    break;
  case UI_FOUR:
    local_198._0_4_ = 4;
    break;
  case UI_FIVE:
    local_198._0_4_ = 5;
    break;
  case UI_SIX:
    local_198._0_4_ = 6;
    break;
  case UI_SEVEN:
    local_198._0_4_ = 7;
    break;
  case UI_EIGHT:
    local_198._0_4_ = 8;
    break;
  case UI_ONEHUNDREDONE:
    local_198._0_4_ = 0x65;
    break;
  case UI2_MINUS_ONE:
    local_198._0_8_ = (TestLog *)0xffffffffffffffff;
    goto LAB_0062a1a9;
  case UI2_ZERO:
  case UV2_ZERO:
    local_198._0_8_ = (TestLog *)0x0;
    goto LAB_0062a1a9;
  case UI2_ONE:
    local_198._0_8_ = (TestLog *)0x100000001;
    goto LAB_0062a1a9;
  case UI2_TWO:
    local_198._0_8_ = (TestLog *)0x200000002;
    goto LAB_0062a1a9;
  case UI2_THREE:
    local_198._0_8_ = (TestLog *)0x300000003;
    goto LAB_0062a1a9;
  case UI2_FOUR:
    local_198._0_8_ = (TestLog *)0x400000004;
    goto LAB_0062a1a9;
  case UI2_FIVE:
    local_198._0_8_ = (TestLog *)0x500000005;
    goto LAB_0062a1a9;
  case UI3_MINUS_ONE:
    local_198._8_4_ = 0xffffffff;
    local_198._0_8_ = (TestLog *)0xffffffffffffffff;
    goto LAB_0062a0ea;
  case UI3_ZERO:
  case UV3_ZERO:
    local_198._8_4_ = 0;
    local_198._0_8_ = (TestLog *)0x0;
    goto LAB_0062a0ea;
  case UI3_ONE:
    local_198._0_8_ = (TestLog *)0x100000001;
    local_198._8_4_ = 1;
    goto LAB_0062a0ea;
  case UI3_TWO:
    local_198._0_8_ = (TestLog *)0x200000002;
    local_198._8_4_ = 2;
    goto LAB_0062a0ea;
  case UI3_THREE:
    local_198._0_8_ = (TestLog *)0x300000003;
    local_198._8_4_ = 3;
    goto LAB_0062a0ea;
  case UI3_FOUR:
    local_198._0_8_ = (TestLog *)0x400000004;
    local_198._8_4_ = 4;
    goto LAB_0062a0ea;
  case UI3_FIVE:
    local_198._0_8_ = (TestLog *)0x500000005;
    local_198._8_4_ = 5;
    goto LAB_0062a0ea;
  case UI4_MINUS_ONE:
    local_198._12_4_ = 0xffffffff;
    local_198._0_4_ = 0xffffffff;
    local_198._4_4_ = 0xffffffff;
    local_198[8] = (ostringstream)0xff;
    local_198._9_3_ = 0xffffff;
    goto LAB_0062a254;
  case UI4_ONE:
    local_198._0_4_ = 1;
    local_198._4_4_ = 1;
    local_198[8] = (ostringstream)0x1;
    local_198._9_3_ = 0;
    local_198._12_4_ = 1;
    goto LAB_0062a254;
  case UI4_TWO:
    local_198._0_4_ = 2;
    local_198._4_4_ = 2;
    local_198[8] = (ostringstream)0x2;
    local_198._9_3_ = 0;
    local_198._12_4_ = 2;
    goto LAB_0062a254;
  case UI4_THREE:
    local_198._0_4_ = 3;
    local_198._4_4_ = 3;
    local_198[8] = (ostringstream)0x3;
    local_198._9_3_ = 0;
    local_198._12_4_ = 3;
    goto LAB_0062a254;
  case UI4_FOUR:
    local_198._0_4_ = 4;
    local_198._4_4_ = 4;
    local_198[8] = (ostringstream)0x4;
    local_198._9_3_ = 0;
    local_198._12_4_ = 4;
    goto LAB_0062a254;
  case UI4_FIVE:
    local_198._0_4_ = 5;
    local_198._4_4_ = 5;
    local_198[8] = (ostringstream)0x5;
    local_198._9_3_ = 0;
    local_198._12_4_ = 5;
    goto LAB_0062a254;
  case UF_ONE:
    local_198._0_4_ = 0x3f800000;
    break;
  case UF_TWO:
    local_198._0_4_ = 0x40000000;
    break;
  case UF_THREE:
    local_198._0_4_ = 0x40400000;
    break;
  case UF_FOUR:
    local_198._0_4_ = 0x40800000;
    break;
  case UF_FIVE:
    local_198._0_4_ = 0x40a00000;
    break;
  case UF_SIX:
    local_198._0_4_ = 0x40c00000;
    break;
  case UF_SEVEN:
    local_198._0_4_ = 0x40e00000;
    break;
  case UF_EIGHT:
    local_198._0_4_ = 0x41000000;
    break;
  case UF_HALF:
    local_198._0_4_ = 0x3f000000;
    break;
  case UF_THIRD:
    local_198._0_4_ = 0x3eaaaaab;
    break;
  case UF_FOURTH:
    local_198._0_4_ = 0x3e800000;
    break;
  case UF_FIFTH:
    local_198._0_4_ = 0x3e4ccccd;
    break;
  case UF_SIXTH:
    local_198._0_4_ = 0x3e2aaaab;
    break;
  case UF_SEVENTH:
    local_198._0_4_ = 0x3e124925;
    break;
  case UF_EIGHTH:
    local_198._0_4_ = 0x3e000000;
    break;
  case UV2_MINUS_ONE:
    local_198._0_8_ = (TestLog *)0xbf800000bf800000;
    goto LAB_0062a1a9;
  case UV2_ONE:
    local_198._0_8_ = (TestLog *)0x3f8000003f800000;
    goto LAB_0062a1a9;
  case UV2_TWO:
    local_198._0_8_ = (TestLog *)0x4000000040000000;
    goto LAB_0062a1a9;
  case UV2_THREE:
    local_198._0_8_ = (TestLog *)0x4040000040400000;
    goto LAB_0062a1a9;
  case UV2_HALF:
    local_198._0_8_ = (TestLog *)0x3f0000003f000000;
LAB_0062a1a9:
    dataSize = 8;
    goto LAB_0062a261;
  case UV3_MINUS_ONE:
    local_198._0_8_ = (TestLog *)0xbf800000bf800000;
    local_198._8_4_ = 0xbf800000;
    goto LAB_0062a0ea;
  case UV3_ONE:
    local_198._0_8_ = (TestLog *)0x3f8000003f800000;
    local_198._8_4_ = 0x3f800000;
    goto LAB_0062a0ea;
  case UV3_TWO:
    local_198._0_8_ = (TestLog *)0x4000000040000000;
    local_198._8_4_ = 0x40000000;
    goto LAB_0062a0ea;
  case UV3_THREE:
    local_198._0_8_ = (TestLog *)0x4040000040400000;
    local_198._8_4_ = 0x40400000;
    goto LAB_0062a0ea;
  case UV3_HALF:
    local_198._0_8_ = (TestLog *)0x3f0000003f000000;
    local_198._8_4_ = 0x3f000000;
LAB_0062a0ea:
    dataSize = 0xc;
    goto LAB_0062a261;
  case UV4_MINUS_ONE:
    local_198._0_4_ = 0xbf800000;
    local_198._4_4_ = 0xbf800000;
    local_198[8] = (ostringstream)0x0;
    local_198._9_3_ = 0xbf8000;
    local_198._12_4_ = 0xbf800000;
    goto LAB_0062a254;
  case UV4_TWO:
    local_198._0_4_ = 0x40000000;
    local_198._4_4_ = 0x40000000;
    local_198[8] = (ostringstream)0x0;
    local_198._9_3_ = 0x400000;
    local_198._12_4_ = 0x40000000;
    goto LAB_0062a254;
  case UV4_THREE:
    local_198._0_4_ = 0x40400000;
    local_198._4_4_ = 0x40400000;
    local_198[8] = (ostringstream)0x0;
    local_198._9_3_ = 0x404000;
    local_198._12_4_ = 0x40400000;
    goto LAB_0062a254;
  case UV4_HALF:
    local_198._0_4_ = 0x3f000000;
    local_198._4_4_ = 0x3f000000;
    local_198[8] = (ostringstream)0x0;
    local_198._9_3_ = 0x3f0000;
    local_198._12_4_ = 0x3f000000;
    goto LAB_0062a254;
  case UV4_BLACK:
    local_198._0_4_ = 0;
    local_198._4_4_ = 0;
    local_198[8] = (ostringstream)0x0;
    local_198._9_3_ = 0;
    local_198._12_4_ = 0x3f800000;
    goto LAB_0062a254;
  case UV4_GRAY:
    local_198._0_4_ = 0x3f000000;
    local_198._4_4_ = 0x3f000000;
    local_198[8] = (ostringstream)0x0;
    local_198._9_3_ = 0x3f0000;
    local_198._12_4_ = 0x3f800000;
LAB_0062a254:
    dataSize = 0x10;
    goto LAB_0062a261;
  default:
    local_198._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Unknown Uniform type: ",0x16);
    std::ostream::operator<<(this_00,type);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x78));
    return;
  }
  dataSize = 4;
LAB_0062a261:
  addUniform(this,bindingLocation,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,dataSize,local_198);
  return;
}

Assistant:

void ShaderRenderCaseInstance::useUniform (deUint32 bindingLocation, BaseUniformType type)
{
	#define UNIFORM_CASE(type, value) case type: addUniform(bindingLocation, VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, value); break

	switch(type)
	{
		// Bool
		UNIFORM_CASE(UB_FALSE,	0);
		UNIFORM_CASE(UB_TRUE,	1);

		// BVec4
		UNIFORM_CASE(UB4_FALSE,	tcu::Vec4(0));
		UNIFORM_CASE(UB4_TRUE,	tcu::Vec4(1));

		// Integer
		UNIFORM_CASE(UI_ZERO,	0);
		UNIFORM_CASE(UI_ONE,	1);
		UNIFORM_CASE(UI_TWO,	2);
		UNIFORM_CASE(UI_THREE,	3);
		UNIFORM_CASE(UI_FOUR,	4);
		UNIFORM_CASE(UI_FIVE,	5);
		UNIFORM_CASE(UI_SIX,	6);
		UNIFORM_CASE(UI_SEVEN,	7);
		UNIFORM_CASE(UI_EIGHT,	8);
		UNIFORM_CASE(UI_ONEHUNDREDONE, 101);

		// IVec2
		UNIFORM_CASE(UI2_MINUS_ONE,	tcu::IVec2(-1));
		UNIFORM_CASE(UI2_ZERO,		tcu::IVec2(0));
		UNIFORM_CASE(UI2_ONE,		tcu::IVec2(1));
		UNIFORM_CASE(UI2_TWO,		tcu::IVec2(2));
		UNIFORM_CASE(UI2_THREE,		tcu::IVec2(3));
		UNIFORM_CASE(UI2_FOUR,		tcu::IVec2(4));
		UNIFORM_CASE(UI2_FIVE,		tcu::IVec2(5));

		// IVec3
		UNIFORM_CASE(UI3_MINUS_ONE,	tcu::IVec3(-1));
		UNIFORM_CASE(UI3_ZERO,		tcu::IVec3(0));
		UNIFORM_CASE(UI3_ONE,		tcu::IVec3(1));
		UNIFORM_CASE(UI3_TWO,		tcu::IVec3(2));
		UNIFORM_CASE(UI3_THREE,		tcu::IVec3(3));
		UNIFORM_CASE(UI3_FOUR,		tcu::IVec3(4));
		UNIFORM_CASE(UI3_FIVE,		tcu::IVec3(5));

		// IVec4
		UNIFORM_CASE(UI4_MINUS_ONE, tcu::IVec4(-1));
		UNIFORM_CASE(UI4_ZERO,		tcu::IVec4(0));
		UNIFORM_CASE(UI4_ONE,		tcu::IVec4(1));
		UNIFORM_CASE(UI4_TWO,		tcu::IVec4(2));
		UNIFORM_CASE(UI4_THREE,		tcu::IVec4(3));
		UNIFORM_CASE(UI4_FOUR,		tcu::IVec4(4));
		UNIFORM_CASE(UI4_FIVE,		tcu::IVec4(5));

		// Float
		UNIFORM_CASE(UF_ZERO,		0.0f);
		UNIFORM_CASE(UF_ONE,		1.0f);
		UNIFORM_CASE(UF_TWO,		2.0f);
		UNIFORM_CASE(UF_THREE,		3.0f);
		UNIFORM_CASE(UF_FOUR,		4.0f);
		UNIFORM_CASE(UF_FIVE,		5.0f);
		UNIFORM_CASE(UF_SIX,		6.0f);
		UNIFORM_CASE(UF_SEVEN,		7.0f);
		UNIFORM_CASE(UF_EIGHT,		8.0f);

		UNIFORM_CASE(UF_HALF,		1.0f / 2.0f);
		UNIFORM_CASE(UF_THIRD,		1.0f / 3.0f);
		UNIFORM_CASE(UF_FOURTH,		1.0f / 4.0f);
		UNIFORM_CASE(UF_FIFTH,		1.0f / 5.0f);
		UNIFORM_CASE(UF_SIXTH,		1.0f / 6.0f);
		UNIFORM_CASE(UF_SEVENTH,	1.0f / 7.0f);
		UNIFORM_CASE(UF_EIGHTH,		1.0f / 8.0f);

		// Vec2
		UNIFORM_CASE(UV2_MINUS_ONE,	tcu::Vec2(-1.0f));
		UNIFORM_CASE(UV2_ZERO,		tcu::Vec2(0.0f));
		UNIFORM_CASE(UV2_ONE,		tcu::Vec2(1.0f));
		UNIFORM_CASE(UV2_TWO,		tcu::Vec2(2.0f));
		UNIFORM_CASE(UV2_THREE,		tcu::Vec2(3.0f));

		UNIFORM_CASE(UV2_HALF,		tcu::Vec2(1.0f / 2.0f));

		// Vec3
		UNIFORM_CASE(UV3_MINUS_ONE,	tcu::Vec3(-1.0f));
		UNIFORM_CASE(UV3_ZERO,		tcu::Vec3(0.0f));
		UNIFORM_CASE(UV3_ONE,		tcu::Vec3(1.0f));
		UNIFORM_CASE(UV3_TWO,		tcu::Vec3(2.0f));
		UNIFORM_CASE(UV3_THREE,		tcu::Vec3(3.0f));

		UNIFORM_CASE(UV3_HALF,		tcu::Vec3(1.0f / 2.0f));

		// Vec4
		UNIFORM_CASE(UV4_MINUS_ONE,	tcu::Vec4(-1.0f));
		UNIFORM_CASE(UV4_ZERO,		tcu::Vec4(0.0f));
		UNIFORM_CASE(UV4_ONE,		tcu::Vec4(1.0f));
		UNIFORM_CASE(UV4_TWO,		tcu::Vec4(2.0f));
		UNIFORM_CASE(UV4_THREE,		tcu::Vec4(3.0f));

		UNIFORM_CASE(UV4_HALF,		tcu::Vec4(1.0f / 2.0f));

		UNIFORM_CASE(UV4_BLACK,		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		UNIFORM_CASE(UV4_GRAY,		tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));
		UNIFORM_CASE(UV4_WHITE,		tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

		default:
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Unknown Uniform type: " << type << tcu::TestLog::EndMessage;
			break;
	}

	#undef UNIFORM_CASE
}